

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O2

bool dxil_spv::emit_barrier(Impl *impl,uint32_t memory_flags,uint32_t semantic_flags)

{
  undefined1 extraout_AL;
  Id IVar1;
  Builder *this;
  Operation *this_00;
  Op OVar2;
  
  this = Converter::Impl::builder(impl);
  OVar2 = memory_flags & OpUndef;
  this_00 = Converter::Impl::allocate(impl,OVar2 ^ OpMemoryBarrier);
  if (OVar2 != OpNop) {
    IVar1 = spv::Builder::makeUintConstant(this,2,false);
    Operation::add_id(this_00,IVar1);
  }
  IVar1 = spv::Builder::makeUintConstant(this,((memory_flags & 4) == 0) + 1,false);
  Operation::add_id(this_00,IVar1);
  IVar1 = spv::Builder::makeUintConstant
                    (this,(memory_flags & 2) * 0x80 +
                          (OVar2 << 0xb | (uint)((memory_flags & 0xd) != 0) << 6) + 8,false);
  Operation::add_id(this_00,IVar1);
  Converter::Impl::add(impl,this_00,false);
  return (bool)extraout_AL;
}

Assistant:

static bool emit_barrier(Converter::Impl &impl, uint32_t memory_flags, uint32_t semantic_flags)
{
	auto &builder = impl.builder();
	bool is_sync = (semantic_flags & DXIL::GroupSyncBit) != 0;
	auto *op = impl.allocate(is_sync ? spv::OpControlBarrier : spv::OpMemoryBarrier);
	if (is_sync)
		op->add_id(builder.makeUintConstant(spv::ScopeWorkgroup));

	bool needs_device_memory_scope = false;
	if ((semantic_flags & DXIL::DeviceScopeBit) != 0)
		needs_device_memory_scope = true;

	op->add_id(builder.makeUintConstant(needs_device_memory_scope ? spv::ScopeDevice : spv::ScopeWorkgroup));

	uint32_t semantics = spv::MemorySemanticsAcquireReleaseMask;
	if ((semantic_flags & (DXIL::MemoryTypeNodeInputBit | DXIL::MemoryTypeNodeOutputBit | DXIL::MemoryTypeUavBit)) != 0)
		semantics |= spv::MemorySemanticsUniformMemoryMask;
	if ((semantic_flags & DXIL::MemoryTypeUavBit) != 0)
		semantics |= spv::MemorySemanticsImageMemoryMask;
	if ((semantic_flags & DXIL::MemoryTypeGroupSharedBit) != 0)
		semantics |= spv::MemorySemanticsWorkgroupMemoryMask;

	op->add_id(builder.makeUintConstant(semantics));
	impl.add(op);

	return true;
}